

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypipe.hpp
# Opt level: O2

bool __thiscall
zmq::ypipe_t<zmq::command_t,_16>::unwrite(ypipe_t<zmq::command_t,_16> *this,command_t *value_)

{
  command_t *pcVar1;
  args_t *paVar2;
  endpoint_uri_pair_t **ppeVar3;
  undefined1 *puVar4;
  int iVar5;
  command_t *pcVar6;
  chunk_t *pcVar7;
  object_t *poVar8;
  own_t *poVar9;
  own_t *poVar10;
  endpoint_uri_pair_t *peVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  type_t tVar14;
  undefined4 uVar15;
  command_t *pcVar16;
  
  pcVar6 = this->_f;
  pcVar16 = ((this->_queue)._back_chunk)->values + (this->_queue)._back_pos;
  if (pcVar6 != pcVar16) {
    yqueue_t<zmq::command_t,_16>::unpush(&this->_queue);
    pcVar7 = (this->_queue)._back_chunk;
    iVar5 = (this->_queue)._back_pos;
    pcVar1 = pcVar7->values + iVar5;
    poVar8 = pcVar1->destination;
    tVar14 = pcVar1->type;
    uVar15 = *(undefined4 *)&pcVar1->field_0xc;
    paVar2 = &pcVar7->values[iVar5].args;
    poVar9 = (paVar2->own).object;
    poVar10 = (&paVar2->own)[1].object;
    ppeVar3 = &pcVar7->values[iVar5].args.pipe_peer_stats.endpoint_pair;
    peVar11 = *ppeVar3;
    uVar12 = ppeVar3[1];
    puVar4 = &pcVar7->values[iVar5].field_0x30;
    uVar13 = *(undefined8 *)(puVar4 + 8);
    *(undefined8 *)&value_->field_0x30 = *(undefined8 *)puVar4;
    *(undefined8 *)&value_->field_0x38 = uVar13;
    (value_->args).pipe_peer_stats.endpoint_pair = peVar11;
    *(undefined8 *)&value_->field_0x28 = uVar12;
    (value_->args).own.object = poVar9;
    (value_->args).pipe_peer_stats.socket_base = poVar10;
    value_->destination = poVar8;
    value_->type = tVar14;
    *(undefined4 *)&value_->field_0xc = uVar15;
  }
  return pcVar6 != pcVar16;
}

Assistant:

bool unwrite (T *value_)
    {
        if (_f == &_queue.back ())
            return false;
        _queue.unpush ();
        *value_ = _queue.back ();
        return true;
    }